

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlenderLoader.cpp
# Opt level: O1

aiNode * __thiscall
Assimp::BlenderImporter::ConvertNode
          (BlenderImporter *this,Scene *in,Object *obj,ConversionData *conv_data,
          aiMatrix4x4 *parentTransform)

{
  pointer *pppaVar1;
  pointer *pppaVar2;
  float fVar3;
  float fVar4;
  pointer ppaVar5;
  pointer ppaVar6;
  iterator __position;
  iterator __position_00;
  _func_int **pp_Var7;
  _func_int **pp_Var8;
  char *pcVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  undefined4 uVar21;
  undefined4 uVar22;
  undefined4 uVar23;
  undefined4 uVar24;
  undefined4 uVar25;
  _Head_base<0UL,_aiNode_*,_false> _Var26;
  ConversionData *conv_data_00;
  _Base_ptr p_Var27;
  aiNode *paVar28;
  size_t sVar29;
  ulong uVar30;
  ulong uVar31;
  uint *puVar32;
  float (*pafVar33) [4];
  aiMatrix4x4t<float> *paVar34;
  aiNode **__s;
  Object *extraout_RDX;
  _Rb_tree_header *p_Var35;
  ulong uVar36;
  _Elt_pointer ppOVar37;
  Scene *pSVar38;
  char *pcVar39;
  long lVar40;
  BlenderImporter *this_00;
  long lVar41;
  ConversionData *pCVar42;
  aiMatrix4x4 *paVar43;
  _Self __tmp;
  const_iterator __position_01;
  Object *pOVar44;
  _Elt_pointer ppOVar45;
  float fVar46;
  unique_ptr<aiNode,_std::default_delete<aiNode>_> node;
  aiMatrix4x4t<float> temp;
  aiMatrix4x4 m;
  deque<const_Assimp::Blender::Object_*,_std::allocator<const_Assimp::Blender::Object_*>_> children;
  _Head_base<0UL,_aiNode_*,_false> local_1a0;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  float fStack_188;
  float fStack_184;
  float fStack_180;
  float fStack_17c;
  float fStack_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  float fStack_168;
  float fStack_164;
  float fStack_160;
  float fStack_15c;
  float fStack_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float fStack_148;
  float fStack_144;
  ConversionData *local_140;
  Object *local_138;
  _Elt_pointer ppOStack_130;
  aiMatrix4x4 aStack_128;
  undefined1 local_e8 [16];
  undefined1 local_d8 [16];
  undefined8 uStack_c8;
  undefined8 uStack_c0;
  float fStack_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  _Map_pointer pppOStack_a0;
  BlenderImporter *local_98;
  Scene *local_90;
  _Deque_base<const_Assimp::Blender::Object_*,_std::allocator<const_Assimp::Blender::Object_*>_>
  local_88;
  
  local_88._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_map_size = 0;
  pCVar42 = (ConversionData *)parentTransform;
  local_98 = this;
  local_90 = in;
  std::
  _Deque_base<const_Assimp::Blender::Object_*,_std::allocator<const_Assimp::Blender::Object_*>_>::
  _M_initialize_map(&local_88,0);
  __position_01._M_node = (conv_data->objects)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var35 = &(conv_data->objects)._M_t._M_impl.super__Rb_tree_header;
  local_140 = conv_data;
  if ((_Rb_tree_header *)__position_01._M_node != p_Var35) {
    do {
      local_e8._0_8_ = *(undefined8 *)(__position_01._M_node + 1);
      if (((Object *)local_e8._0_8_)->parent == obj) {
        if (local_88._M_impl.super__Deque_impl_data._M_finish._M_cur ==
            local_88._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
          std::deque<Assimp::Blender::Object_const*,std::allocator<Assimp::Blender::Object_const*>>
          ::_M_push_back_aux<Assimp::Blender::Object_const*const&>
                    ((deque<Assimp::Blender::Object_const*,std::allocator<Assimp::Blender::Object_const*>>
                      *)&local_88,(Object **)local_e8);
        }
        else {
          *local_88._M_impl.super__Deque_impl_data._M_finish._M_cur = (Object *)local_e8._0_8_;
          local_88._M_impl.super__Deque_impl_data._M_finish._M_cur =
               local_88._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
        }
        p_Var27 = (_Base_ptr)std::_Rb_tree_increment(__position_01._M_node);
        std::
        _Rb_tree<Assimp::Blender::Object_const*,Assimp::Blender::Object_const*,std::_Identity<Assimp::Blender::Object_const*>,Assimp::Blender::ObjectCompare,std::allocator<Assimp::Blender::Object_const*>>
        ::erase_abi_cxx11_((_Rb_tree<Assimp::Blender::Object_const*,Assimp::Blender::Object_const*,std::_Identity<Assimp::Blender::Object_const*>,Assimp::Blender::ObjectCompare,std::allocator<Assimp::Blender::Object_const*>>
                            *)local_140,__position_01);
      }
      else {
        p_Var27 = (_Base_ptr)std::_Rb_tree_increment(__position_01._M_node);
      }
      __position_01._M_node = p_Var27;
    } while ((_Rb_tree_header *)p_Var27 != p_Var35);
  }
  paVar28 = (aiNode *)operator_new(0x478);
  pcVar39 = (obj->id).name + 2;
  local_e8._0_8_ = (Object *)local_d8;
  sVar29 = strlen(pcVar39);
  local_138 = obj;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_e8,pcVar39,(obj->id).name + sVar29 + 2);
  aiNode::aiNode(paVar28,(string *)local_e8);
  local_1a0._M_head_impl = paVar28;
  if ((Object *)local_e8._0_8_ != (Object *)local_d8) {
    operator_delete((void *)local_e8._0_8_,local_d8._0_8_ + 1);
  }
  pOVar44 = local_138;
  conv_data_00 = local_140;
  this_00 = (BlenderImporter *)
            (local_138->data).
            super___shared_ptr<Assimp::Blender::ElemBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (this_00 == (BlenderImporter *)0x0) goto switchD_004a2d62_caseD_6;
  switch(local_138->type) {
  case Type_MESH:
    ppaVar5 = (local_140->meshes).arr.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    ppaVar6 = (local_140->meshes).arr.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    pSVar38 = (Scene *)0x76b929;
    CheckActualType((ElemBase *)this_00,"Mesh");
    ConvertMesh(this_00,pSVar38,extraout_RDX,
                (Mesh *)(local_138->data).
                        super___shared_ptr<Assimp::Blender::ElemBase,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr,conv_data_00,&conv_data_00->meshes);
    _Var26._M_head_impl = local_1a0._M_head_impl;
    uVar36 = (long)ppaVar5 - (long)ppaVar6 >> 3;
    uVar30 = (long)(conv_data_00->meshes).arr.
                   super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(conv_data_00->meshes).arr.
                   super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                   super__Vector_impl_data._M_start >> 3;
    uVar31 = uVar30 - uVar36;
    pOVar44 = local_138;
    if (uVar36 <= uVar30 && uVar31 != 0) {
      (local_1a0._M_head_impl)->mNumMeshes = (uint)uVar31;
      puVar32 = (uint *)operator_new__((uVar31 & 0xffffffff) << 2);
      (_Var26._M_head_impl)->mMeshes = puVar32;
      pOVar44 = local_138;
      if ((local_1a0._M_head_impl)->mNumMeshes != 0) {
        uVar30 = 0;
        do {
          (local_1a0._M_head_impl)->mMeshes[uVar30] = (int)uVar36 + (int)uVar30;
          uVar30 = uVar30 + 1;
        } while (uVar30 < (local_1a0._M_head_impl)->mNumMeshes);
      }
    }
    goto switchD_004a2d62_caseD_6;
  case Type_CURVE:
    pcVar39 = "Curve";
    break;
  case Type_SURF:
    pcVar39 = "Surface";
    break;
  case Type_FONT:
    pcVar39 = "Font";
    break;
  case Type_MBALL:
    pcVar39 = "MetaBall";
    break;
  default:
    goto switchD_004a2d62_caseD_6;
  case Type_LAMP:
    pcVar39 = "Lamp";
    CheckActualType((ElemBase *)this_00,"Lamp");
    local_e8._0_8_ =
         ConvertLight(this_00,(Scene *)pcVar39,pOVar44,
                      (Lamp *)(pOVar44->data).
                              super___shared_ptr<Assimp::Blender::ElemBase,_(__gnu_cxx::_Lock_policy)2>
                              ._M_ptr,pCVar42);
    __position._M_current =
         (local_140->lights).arr.super__Vector_base<aiLight_*,_std::allocator<aiLight_*>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (local_140->lights).arr.super__Vector_base<aiLight_*,_std::allocator<aiLight_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<aiLight*,std::allocator<aiLight*>>::_M_realloc_insert<aiLight*const&>
                ((vector<aiLight*,std::allocator<aiLight*>> *)&local_140->lights,__position,
                 (aiLight **)local_e8);
    }
    else {
      *__position._M_current = (aiLight *)local_e8._0_8_;
      pppaVar1 = &(local_140->lights).arr.super__Vector_base<aiLight_*,_std::allocator<aiLight_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
      *pppaVar1 = *pppaVar1 + 1;
    }
    goto switchD_004a2d62_caseD_6;
  case Type_CAMERA:
    pSVar38 = (Scene *)0x79250d;
    CheckActualType((ElemBase *)this_00,"Camera");
    local_e8._0_8_ =
         ConvertCamera(this_00,pSVar38,pOVar44,
                       (Camera *)
                       (pOVar44->data).
                       super___shared_ptr<Assimp::Blender::ElemBase,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr,pCVar42);
    __position_00._M_current =
         (local_140->cameras).arr.super__Vector_base<aiCamera_*,_std::allocator<aiCamera_*>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    if (__position_00._M_current ==
        (local_140->cameras).arr.super__Vector_base<aiCamera_*,_std::allocator<aiCamera_*>_>._M_impl
        .super__Vector_impl_data._M_end_of_storage) {
      std::vector<aiCamera*,std::allocator<aiCamera*>>::_M_realloc_insert<aiCamera*const&>
                ((vector<aiCamera*,std::allocator<aiCamera*>> *)&local_140->cameras,__position_00,
                 (aiCamera **)local_e8);
    }
    else {
      *__position_00._M_current = (aiCamera *)local_e8._0_8_;
      pppaVar2 = &(local_140->cameras).arr.
                  super__Vector_base<aiCamera_*,_std::allocator<aiCamera_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      *pppaVar2 = *pppaVar2 + 1;
    }
    goto switchD_004a2d62_caseD_6;
  case Type_WAVE:
    pcVar39 = "Wave";
    break;
  case Type_LATTICE:
    pcVar39 = "Lattice";
  }
  NotSupportedObjectType(local_138,pcVar39);
switchD_004a2d62_caseD_6:
  pafVar33 = pOVar44->obmat;
  lVar40 = 0;
  do {
    fVar46 = (*pafVar33)[0];
    paVar43 = &(local_1a0._M_head_impl)->mTransformation;
    lVar41 = 0;
    while( true ) {
      (&paVar43->a1)[lVar40] = fVar46;
      if (lVar41 + 1 == 4) break;
      fVar46 = (*pafVar33)[lVar41 + 1];
      paVar43 = (aiMatrix4x4 *)&((local_1a0._M_head_impl)->mTransformation).b1;
      lVar41 = lVar41 + 1;
    }
    lVar40 = lVar40 + 1;
    pafVar33 = pafVar33 + 1;
  } while (lVar40 != 4);
  local_e8._0_8_ = *(undefined8 *)parentTransform;
  local_e8._8_4_ = parentTransform->a3;
  local_e8._12_4_ = parentTransform->a4;
  local_d8._0_8_ = *(undefined8 *)&parentTransform->b1;
  local_d8._8_8_ = *(undefined8 *)&parentTransform->b3;
  uStack_c8 = *(_func_int ***)&parentTransform->c1;
  uStack_c0 = *(char **)&parentTransform->c3;
  _fStack_b8 = *(undefined8 *)&parentTransform->d1;
  _fStack_b0 = *(undefined8 *)&parentTransform->d3;
  paVar34 = aiMatrix4x4t<float>::Inverse((aiMatrix4x4t<float> *)local_e8);
  ppOVar45 = local_88._M_impl.super__Deque_impl_data._M_start._M_last;
  ppOVar37 = local_88._M_impl.super__Deque_impl_data._M_start._M_cur;
  _Var26._M_head_impl = local_1a0._M_head_impl;
  pOVar44 = *(Object **)paVar34;
  local_e8._8_4_ = paVar34->a3;
  local_e8._12_4_ = paVar34->a4;
  pp_Var7 = *(_func_int ***)&paVar34->b1;
  pcVar39 = *(char **)&paVar34->b3;
  pp_Var8 = *(_func_int ***)&paVar34->c1;
  pcVar9 = *(char **)&paVar34->c3;
  _fStack_b8 = *(undefined8 *)&paVar34->d1;
  _fStack_b0 = *(undefined8 *)&paVar34->d3;
  local_e8._0_4_ = SUB84(pOVar44,0);
  local_e8._4_4_ = (undefined4)((ulong)pOVar44 >> 0x20);
  fStack_164 = ((local_1a0._M_head_impl)->mTransformation).b1;
  fVar46 = ((local_1a0._M_head_impl)->mTransformation).a1;
  fVar3 = ((local_1a0._M_head_impl)->mTransformation).a2;
  fStack_160 = ((local_1a0._M_head_impl)->mTransformation).c1;
  fStack_178 = ((local_1a0._M_head_impl)->mTransformation).d1;
  fStack_174 = fStack_178 * (float)local_e8._12_4_ +
               fStack_160 * (float)local_e8._8_4_ +
               fVar46 * (float)local_e8._0_4_ + (float)local_e8._4_4_ * fStack_164;
  fStack_184 = ((local_1a0._M_head_impl)->mTransformation).b2;
  fStack_188 = ((local_1a0._M_head_impl)->mTransformation).c2;
  fStack_16c = ((local_1a0._M_head_impl)->mTransformation).d2;
  fStack_144 = fStack_16c * (float)local_e8._12_4_ +
               fStack_188 * (float)local_e8._8_4_ +
               fVar3 * (float)local_e8._0_4_ + (float)local_e8._4_4_ * fStack_184;
  fStack_18c = ((local_1a0._M_head_impl)->mTransformation).b3;
  fStack_17c = ((local_1a0._M_head_impl)->mTransformation).a3;
  fStack_170 = ((local_1a0._M_head_impl)->mTransformation).c3;
  fStack_190 = ((local_1a0._M_head_impl)->mTransformation).d3;
  fStack_148 = fStack_190 * (float)local_e8._12_4_ +
               fStack_170 * (float)local_e8._8_4_ +
               fStack_17c * (float)local_e8._0_4_ + (float)local_e8._4_4_ * fStack_18c;
  fVar4 = ((local_1a0._M_head_impl)->mTransformation).b4;
  fStack_180 = ((local_1a0._M_head_impl)->mTransformation).a4;
  fStack_194 = ((local_1a0._M_head_impl)->mTransformation).c4;
  fStack_168 = ((local_1a0._M_head_impl)->mTransformation).d4;
  fStack_14c = (float)local_e8._12_4_ * fStack_168 +
               (float)local_e8._8_4_ * fStack_194 +
               (float)local_e8._0_4_ * fStack_180 + (float)local_e8._4_4_ * fVar4;
  local_d8._4_4_ = (undefined4)((ulong)pp_Var7 >> 0x20);
  local_d8._0_4_ = SUB84(pp_Var7,0);
  local_d8._8_4_ = SUB84(pcVar39,0);
  local_d8._12_4_ = (undefined4)((ulong)pcVar39 >> 0x20);
  fStack_150 = fStack_178 * (float)local_d8._12_4_ +
               fStack_160 * (float)local_d8._8_4_ +
               fVar46 * (float)local_d8._0_4_ + (float)local_d8._4_4_ * fStack_164;
  fStack_154 = fStack_16c * (float)local_d8._12_4_ +
               fStack_188 * (float)local_d8._8_4_ +
               fVar3 * (float)local_d8._0_4_ + (float)local_d8._4_4_ * fStack_184;
  fStack_158 = fStack_190 * (float)local_d8._12_4_ +
               fStack_170 * (float)local_d8._8_4_ +
               fStack_17c * (float)local_d8._0_4_ + (float)local_d8._4_4_ * fStack_18c;
  uStack_c8._4_4_ = (float)((ulong)pp_Var8 >> 0x20);
  uStack_c8._0_4_ = SUB84(pp_Var8,0);
  uStack_c0._0_4_ = SUB84(pcVar9,0);
  uStack_c0._4_4_ = (float)((ulong)pcVar9 >> 0x20);
  fStack_15c = fStack_178 * uStack_c0._4_4_ +
               fStack_160 * (float)uStack_c0 +
               fVar46 * (float)uStack_c8 + uStack_c8._4_4_ * fStack_164;
  ((local_1a0._M_head_impl)->mTransformation).a1 = fStack_174;
  ((local_1a0._M_head_impl)->mTransformation).a2 = fStack_144;
  ((local_1a0._M_head_impl)->mTransformation).a3 = fStack_148;
  ((local_1a0._M_head_impl)->mTransformation).a4 = fStack_14c;
  ((local_1a0._M_head_impl)->mTransformation).b1 = fStack_150;
  ((local_1a0._M_head_impl)->mTransformation).b2 = fStack_154;
  ((local_1a0._M_head_impl)->mTransformation).b3 = fStack_158;
  ((local_1a0._M_head_impl)->mTransformation).b4 =
       (float)local_d8._12_4_ * fStack_168 +
       (float)local_d8._8_4_ * fStack_194 +
       (float)local_d8._0_4_ * fStack_180 + (float)local_d8._4_4_ * fVar4;
  ((local_1a0._M_head_impl)->mTransformation).c1 = fStack_15c;
  ((local_1a0._M_head_impl)->mTransformation).c2 =
       fStack_16c * uStack_c0._4_4_ +
       fStack_188 * (float)uStack_c0 + fVar3 * (float)uStack_c8 + uStack_c8._4_4_ * fStack_184;
  ((local_1a0._M_head_impl)->mTransformation).c3 =
       fStack_190 * uStack_c0._4_4_ +
       fStack_170 * (float)uStack_c0 + fStack_17c * (float)uStack_c8 + uStack_c8._4_4_ * fStack_18c;
  ((local_1a0._M_head_impl)->mTransformation).c4 =
       uStack_c0._4_4_ * fStack_168 +
       (float)uStack_c0 * fStack_194 + (float)uStack_c8 * fStack_180 + uStack_c8._4_4_ * fVar4;
  ((local_1a0._M_head_impl)->mTransformation).d1 =
       fStack_178 * fStack_ac + fStack_160 * fStack_b0 + fVar46 * fStack_b8 + fStack_164 * fStack_b4
  ;
  ((local_1a0._M_head_impl)->mTransformation).d2 =
       fStack_16c * fStack_ac + fStack_188 * fStack_b0 + fVar3 * fStack_b8 + fStack_184 * fStack_b4;
  ((local_1a0._M_head_impl)->mTransformation).d3 =
       fStack_190 * fStack_ac +
       fStack_170 * fStack_b0 + fStack_17c * fStack_b8 + fStack_18c * fStack_b4;
  ((local_1a0._M_head_impl)->mTransformation).d4 =
       fStack_168 * fStack_ac + fStack_194 * fStack_b0 + fStack_180 * fStack_b8 + fStack_b4 * fVar4;
  pppOStack_a0 = local_88._M_impl.super__Deque_impl_data._M_start._M_node;
  ppOStack_130 = local_88._M_impl.super__Deque_impl_data._M_finish._M_cur;
  uVar30 = ((long)local_88._M_impl.super__Deque_impl_data._M_start._M_last -
            (long)local_88._M_impl.super__Deque_impl_data._M_start._M_cur >> 3) +
           ((long)local_88._M_impl.super__Deque_impl_data._M_finish._M_cur -
            (long)local_88._M_impl.super__Deque_impl_data._M_finish._M_first >> 3) +
           ((((ulong)((long)local_88._M_impl.super__Deque_impl_data._M_finish._M_node -
                     (long)local_88._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
           (ulong)(local_88._M_impl.super__Deque_impl_data._M_finish._M_node == (_Map_pointer)0x0))
           * 0x40;
  local_e8._0_8_ = pOVar44;
  local_d8._0_8_ = pp_Var7;
  local_d8._8_8_ = pcVar39;
  uStack_c8 = pp_Var8;
  uStack_c0 = pcVar9;
  if (uVar30 != 0) {
    (local_1a0._M_head_impl)->mNumChildren = (uint)uVar30;
    uVar30 = (uVar30 & 0xffffffff) << 3;
    __s = (aiNode **)operator_new__(uVar30);
    memset(__s,0,uVar30);
    (_Var26._M_head_impl)->mChildren = __s;
    if (ppOVar37 != ppOStack_130) {
      do {
        uVar10 = ((local_1a0._M_head_impl)->mTransformation).a1;
        uVar11 = ((local_1a0._M_head_impl)->mTransformation).a2;
        uVar12 = ((local_1a0._M_head_impl)->mTransformation).a3;
        uVar13 = ((local_1a0._M_head_impl)->mTransformation).a4;
        uVar14 = ((local_1a0._M_head_impl)->mTransformation).b1;
        uVar15 = ((local_1a0._M_head_impl)->mTransformation).b2;
        uVar16 = ((local_1a0._M_head_impl)->mTransformation).b3;
        uVar17 = ((local_1a0._M_head_impl)->mTransformation).b4;
        uVar18 = ((local_1a0._M_head_impl)->mTransformation).c1;
        uVar19 = ((local_1a0._M_head_impl)->mTransformation).c2;
        uVar20 = ((local_1a0._M_head_impl)->mTransformation).c3;
        uVar21 = ((local_1a0._M_head_impl)->mTransformation).c4;
        uVar22 = ((local_1a0._M_head_impl)->mTransformation).d1;
        uVar23 = ((local_1a0._M_head_impl)->mTransformation).d2;
        uVar24 = ((local_1a0._M_head_impl)->mTransformation).d3;
        uVar25 = ((local_1a0._M_head_impl)->mTransformation).d4;
        fStack_164 = parentTransform->b1;
        fVar46 = parentTransform->a1;
        fStack_16c = parentTransform->a2;
        fStack_17c = parentTransform->c1;
        fStack_168 = parentTransform->d1;
        fStack_144 = fStack_168 * (float)uVar13 +
                     fStack_17c * (float)uVar12 +
                     fVar46 * (float)uVar10 + fStack_164 * (float)uVar11;
        fStack_18c = parentTransform->b2;
        fVar3 = parentTransform->c2;
        fStack_180 = parentTransform->d2;
        fStack_148 = fStack_180 * (float)uVar13 +
                     fVar3 * (float)uVar12 + fStack_16c * (float)uVar10 + (float)uVar11 * fStack_18c
        ;
        fStack_190 = parentTransform->b3;
        fVar4 = parentTransform->a3;
        fStack_188 = parentTransform->c3;
        fStack_194 = parentTransform->d3;
        fStack_14c = fStack_194 * (float)uVar13 +
                     fStack_188 * (float)uVar12 + fVar4 * (float)uVar10 + (float)uVar11 * fStack_190
        ;
        fStack_178 = parentTransform->b4;
        fStack_184 = parentTransform->a4;
        fStack_174 = parentTransform->c4;
        fStack_170 = parentTransform->d4;
        fStack_150 = (float)uVar13 * fStack_170 +
                     (float)uVar12 * fStack_174 +
                     (float)uVar10 * fStack_184 + (float)uVar11 * fStack_178;
        fStack_154 = fStack_168 * (float)uVar17 +
                     fStack_17c * (float)uVar16 +
                     fVar46 * (float)uVar14 + fStack_164 * (float)uVar15;
        fStack_158 = fStack_180 * (float)uVar17 +
                     fVar3 * (float)uVar16 + fStack_16c * (float)uVar14 + fStack_18c * (float)uVar15
        ;
        fStack_15c = fStack_194 * (float)uVar17 +
                     fStack_188 * (float)uVar16 + fVar4 * (float)uVar14 + fStack_190 * (float)uVar15
        ;
        fStack_160 = fStack_168 * (float)uVar21 +
                     fStack_17c * (float)uVar20 +
                     fVar46 * (float)uVar18 + fStack_164 * (float)uVar19;
        aStack_128.a2 = fStack_148;
        aStack_128.a1 = fStack_144;
        aStack_128.a4 = fStack_150;
        aStack_128.a3 = fStack_14c;
        aStack_128.b2 = fStack_158;
        aStack_128.b1 = fStack_154;
        aStack_128.b4 =
             (float)uVar17 * fStack_170 +
             (float)uVar16 * fStack_174 + (float)uVar14 * fStack_184 + (float)uVar15 * fStack_178;
        aStack_128.b3 = fStack_15c;
        aStack_128.c2 =
             fStack_180 * (float)uVar21 +
             fVar3 * (float)uVar20 + fStack_16c * (float)uVar18 + fStack_18c * (float)uVar19;
        aStack_128.c1 = fStack_160;
        aStack_128.c4 =
             (float)uVar21 * fStack_170 +
             (float)uVar20 * fStack_174 + (float)uVar18 * fStack_184 + (float)uVar19 * fStack_178;
        aStack_128.c3 =
             fStack_194 * (float)uVar21 +
             fStack_188 * (float)uVar20 + fVar4 * (float)uVar18 + fStack_190 * (float)uVar19;
        aStack_128.d2 =
             fStack_180 * (float)uVar25 +
             fVar3 * (float)uVar24 + fStack_16c * (float)uVar22 + fStack_18c * (float)uVar23;
        aStack_128.d1 =
             fStack_168 * (float)uVar25 +
             fStack_17c * (float)uVar24 + fVar46 * (float)uVar22 + fStack_164 * (float)uVar23;
        aStack_128.d4 =
             fStack_170 * (float)uVar25 +
             fStack_174 * (float)uVar24 + fStack_184 * (float)uVar22 + fStack_178 * (float)uVar23;
        aStack_128.d3 =
             fStack_194 * (float)uVar25 +
             fStack_188 * (float)uVar24 + fVar4 * (float)uVar22 + fStack_190 * (float)uVar23;
        paVar28 = ConvertNode(local_98,local_90,*ppOVar37,local_140,&aStack_128);
        *__s = paVar28;
        paVar28->mParent = local_1a0._M_head_impl;
        ppOVar37 = ppOVar37 + 1;
        if (ppOVar37 == ppOVar45) {
          ppOVar37 = pppOStack_a0[1];
          pppOStack_a0 = pppOStack_a0 + 1;
          ppOVar45 = ppOVar37 + 0x40;
        }
        __s = __s + 1;
      } while (ppOVar37 != ppOStack_130);
    }
  }
  Blender::BlenderModifierShowcase::ApplyModifiers
            (local_98->modifier_cache,local_1a0._M_head_impl,local_140,local_90,local_138);
  _Var26._M_head_impl = local_1a0._M_head_impl;
  local_1a0._M_head_impl = (aiNode *)0x0;
  std::unique_ptr<aiNode,_std::default_delete<aiNode>_>::~unique_ptr
            ((unique_ptr<aiNode,_std::default_delete<aiNode>_> *)&local_1a0);
  std::
  _Deque_base<const_Assimp::Blender::Object_*,_std::allocator<const_Assimp::Blender::Object_*>_>::
  ~_Deque_base(&local_88);
  return _Var26._M_head_impl;
}

Assistant:

aiNode* BlenderImporter::ConvertNode(const Scene& in, const Object* obj, ConversionData& conv_data, const aiMatrix4x4& parentTransform)
{
    std::deque<const Object*> children;
    for(ObjectSet::iterator it = conv_data.objects.begin(); it != conv_data.objects.end() ;) {
        const Object* object = *it;
        if (object->parent == obj) {
            children.push_back(object);

            conv_data.objects.erase(it++);
            continue;
        }
        ++it;
    }

    std::unique_ptr<aiNode> node(new aiNode(obj->id.name+2)); // skip over the name prefix 'OB'
    if (obj->data) {
        switch (obj->type)
        {
        case Object :: Type_EMPTY:
            break; // do nothing


            // supported object types
        case Object :: Type_MESH: {
            const size_t old = conv_data.meshes->size();

            CheckActualType(obj->data.get(),"Mesh");
            ConvertMesh(in,obj,static_cast<const Mesh*>(obj->data.get()),conv_data,conv_data.meshes);

            if (conv_data.meshes->size() > old) {
                node->mMeshes = new unsigned int[node->mNumMeshes = static_cast<unsigned int>(conv_data.meshes->size()-old)];
                for (unsigned int i = 0; i < node->mNumMeshes; ++i) {
                    node->mMeshes[i] = static_cast<unsigned int>(i + old);
                }
            }}
            break;
        case Object :: Type_LAMP: {
            CheckActualType(obj->data.get(),"Lamp");
            aiLight* mesh = ConvertLight(in,obj,static_cast<const Lamp*>(
                obj->data.get()),conv_data);

            if (mesh) {
                conv_data.lights->push_back(mesh);
            }}
            break;
        case Object :: Type_CAMERA: {
            CheckActualType(obj->data.get(),"Camera");
            aiCamera* mesh = ConvertCamera(in,obj,static_cast<const Camera*>(
                obj->data.get()),conv_data);

            if (mesh) {
                conv_data.cameras->push_back(mesh);
            }}
            break;


            // unsupported object types / log, but do not break
        case Object :: Type_CURVE:
            NotSupportedObjectType(obj,"Curve");
            break;
        case Object :: Type_SURF:
            NotSupportedObjectType(obj,"Surface");
            break;
        case Object :: Type_FONT:
            NotSupportedObjectType(obj,"Font");
            break;
        case Object :: Type_MBALL:
            NotSupportedObjectType(obj,"MetaBall");
            break;
        case Object :: Type_WAVE:
            NotSupportedObjectType(obj,"Wave");
            break;
        case Object :: Type_LATTICE:
            NotSupportedObjectType(obj,"Lattice");
            break;

            // invalid or unknown type
        default:
            break;
        }
    }

    for(unsigned int x = 0; x < 4; ++x) {
        for(unsigned int y = 0; y < 4; ++y) {
            node->mTransformation[y][x] = obj->obmat[x][y];
        }
    }

    aiMatrix4x4 m = parentTransform;
    m = m.Inverse();

    node->mTransformation = m*node->mTransformation;

    if (children.size()) {
        node->mNumChildren = static_cast<unsigned int>(children.size());
        aiNode** nd = node->mChildren = new aiNode*[node->mNumChildren]();
        for (const Object* nobj :children) {
            *nd = ConvertNode(in,nobj,conv_data,node->mTransformation * parentTransform);
            (*nd++)->mParent = node.get();
        }
    }

    // apply modifiers
    modifier_cache->ApplyModifiers(*node,conv_data,in,*obj);

    return node.release();
}